

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool __thiscall doctest::detail::TestCase::operator<(TestCase *this,TestCase *other)

{
  int iVar1;
  int file_cmp;
  int name_cmp;
  TestCase *other_local;
  TestCase *this_local;
  
  if ((this->super_TestCaseData).m_line == (other->super_TestCaseData).m_line) {
    iVar1 = strcmp((this->super_TestCaseData).m_name,(other->super_TestCaseData).m_name);
    if (iVar1 == 0) {
      iVar1 = String::compare((String *)this,(String *)other,false);
      if (iVar1 == 0) {
        this_local._7_1_ = this->m_template_id < other->m_template_id;
      }
      else {
        this_local._7_1_ = iVar1 < 0;
      }
    }
    else {
      this_local._7_1_ = iVar1 < 0;
    }
  }
  else {
    this_local._7_1_ = (this->super_TestCaseData).m_line < (other->super_TestCaseData).m_line;
  }
  return this_local._7_1_;
}

Assistant:

bool TestCase::operator<(const TestCase& other) const {
        // this will be used only to differentiate between test cases - not relevant for sorting
        if(m_line != other.m_line)
            return m_line < other.m_line;
        const int name_cmp = strcmp(m_name, other.m_name);
        if(name_cmp != 0)
            return name_cmp < 0;
        const int file_cmp = m_file.compare(other.m_file);
        if(file_cmp != 0)
            return file_cmp < 0;
        return m_template_id < other.m_template_id;
    }